

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unifiedcache.cpp
# Opt level: O1

void __thiscall
icu_63::UnifiedCache::_put
          (UnifiedCache *this,UHashElement *element,SharedObject *value,UErrorCode status)

{
  int iVar1;
  SharedObject *value_00;
  void *pvVar2;
  
  value_00 = (SharedObject *)(element->value).pointer;
  pvVar2 = (element->key).pointer;
  *(UErrorCode *)((long)pvVar2 + 8) = status;
  iVar1 = value->softRefCount;
  if (iVar1 == 0) {
    *(undefined1 *)((long)pvVar2 + 0xc) = 1;
    value->cachePtr = &this->super_UnifiedCacheBase;
    this->fNumValuesTotal = this->fNumValuesTotal + 1;
    this->fNumValuesInUse = this->fNumValuesInUse + 1;
  }
  value->softRefCount = iVar1 + 1;
  (element->value).pointer = value;
  removeSoftRef(this,value_00);
  umtx_condBroadcast_63(&gInProgressValueAddedCond);
  return;
}

Assistant:

void UnifiedCache::_put(
        const UHashElement *element,
        const SharedObject *value,
        const UErrorCode status) const {
    U_ASSERT(_inProgress(element));
    const CacheKeyBase *theKey = (const CacheKeyBase *) element->key.pointer;
    const SharedObject *oldValue = (const SharedObject *) element->value.pointer;
    theKey->fCreationStatus = status;
    if (value->softRefCount == 0) {
        _registerMaster(theKey, value);
    }
    value->softRefCount++;
    UHashElement *ptr = const_cast<UHashElement *>(element);
    ptr->value.pointer = (void *) value;
    U_ASSERT(oldValue == fNoValue);
    removeSoftRef(oldValue);

    // Tell waiting threads that we replace in-progress status with
    // an error.
    umtx_condBroadcast(&gInProgressValueAddedCond);
}